

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgraph.cpp
# Opt level: O2

void __thiscall Gecko::Subgraph::Subgraph(Subgraph *this,Graph *g,uint n)

{
  Subnode *pSVar1;
  out_of_range *this_00;
  long lVar2;
  ulong uVar3;
  allocator local_39;
  string local_38 [32];
  
  this->g = g;
  this->n = n;
  this->f = g->functional;
  (this->min).super_WeightedValue = (WeightedValue)0x0;
  if (n < 0x11) {
    uVar3 = (ulong)(n << ((byte)n & 0x1f)) * 0xc;
    pSVar1 = (Subnode *)operator_new__(uVar3);
    if (n != 0) {
      lVar2 = 0;
      do {
        *(undefined8 *)((long)&(pSVar1->cost).super_WeightedValue.value + lVar2) = 0;
        lVar2 = lVar2 + 0xc;
      } while (uVar3 - lVar2 != 0);
    }
    this->cache = pSVar1;
    return;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string(local_38,"optimization window too large",&local_39);
  std::out_of_range::out_of_range(this_00,local_38);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

Subgraph::Subgraph(Graph* g, uint n) : g(g), n(n), f(g->functional)
{
  if (n > GECKO_WINDOW_MAX)
    throw std::out_of_range("optimization window too large");
  cache = new Subnode[n << n];
}